

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall
Catch::SonarQubeReporter::SonarQubeReporter(SonarQubeReporter *this,ReporterConfig *config)

{
  ReporterConfig *in_RDI;
  CumulativeReporterBase *unaff_retaddr;
  ReporterConfig *os;
  
  os = in_RDI;
  CumulativeReporterBase::CumulativeReporterBase(unaff_retaddr,in_RDI);
  (in_RDI->m_stream).m_ptr = (IStream *)&PTR__SonarQubeReporter_002a7148;
  XmlWriter::XmlWriter((XmlWriter *)unaff_retaddr,(ostream *)os);
  *(undefined1 *)&in_RDI->m_fullConfig = 1;
  *(undefined1 *)((long)&in_RDI->m_fullConfig + 1) = 1;
  *(undefined1 *)&in_RDI[1].m_customOptions._M_t._M_impl = 0;
  return;
}

Assistant:

SonarQubeReporter(ReporterConfig&& config)
        : CumulativeReporterBase(CATCH_MOVE(config))
        , xml(m_stream) {
            m_preferences.shouldRedirectStdOut = true;
            m_preferences.shouldReportAllAssertions = true;
            m_shouldStoreSuccesfulAssertions = false;
        }